

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

char * mpc_err_string(mpc_err_t *x)

{
  byte bVar1;
  char **max;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  char *fmt;
  int *max_00;
  int *max_01;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  int *extraout_RDX_03;
  int *piVar8;
  int *max_02;
  long lVar9;
  int pos;
  int local_2c;
  
  local_2c = 0;
  pcVar3 = (char *)calloc(1,0x400);
  if (x->failure != (char *)0x0) {
    mpc_err_string_cat(pcVar3,&local_2c,max_00,"%s: error: %s\n",x->filename);
    return pcVar3;
  }
  lVar4 = (x->state).col + 1;
  mpc_err_string_cat(pcVar3,&local_2c,max_00,"%s:%li:%li: error: expected ",x->filename,
                     (x->state).row + 1,lVar4);
  iVar2 = x->expected_num;
  piVar8 = max_01;
  if (iVar2 == 0) {
    mpc_err_string_cat(pcVar3,&local_2c,max_01,"ERROR: NOTHING EXPECTED");
    iVar2 = x->expected_num;
    piVar8 = extraout_RDX;
  }
  if (iVar2 == 1) {
    mpc_err_string_cat(pcVar3,&local_2c,piVar8,"%s",*x->expected);
    iVar2 = x->expected_num;
    piVar8 = extraout_RDX_00;
  }
  if (1 < iVar2) {
    if (iVar2 == 2) {
      lVar5 = 2;
      lVar7 = 0;
    }
    else {
      lVar9 = 0;
      do {
        mpc_err_string_cat(pcVar3,&local_2c,piVar8,"%s, ",x->expected[lVar9]);
        lVar9 = lVar9 + 1;
        lVar5 = (long)x->expected_num;
        lVar7 = lVar5 + -2;
        piVar8 = extraout_RDX_01;
      } while (lVar9 < lVar7);
    }
    max = x->expected;
    mpc_err_string_cat(pcVar3,&local_2c,(int *)max,"%s or %s",max[lVar7],max[lVar5 + -1],lVar4);
    piVar8 = extraout_RDX_02;
  }
  mpc_err_string_cat(pcVar3,&local_2c,piVar8," at ");
  bVar1 = x->received;
  builtin_strncpy(char_unescape_buffer,"\' \'",4);
  if ((ulong)bVar1 < 0xe) {
    piVar8 = (int *)((long)&switchD_001dc101::switchdataD_001ff91c +
                    (long)(int)(&switchD_001dc101::switchdataD_001ff91c)[bVar1]);
    switch(bVar1) {
    case 0:
      fmt = "end of input";
      break;
    default:
      goto switchD_001dc101_caseD_1;
    case 7:
      fmt = "bell";
      break;
    case 8:
      fmt = "backspace";
      break;
    case 9:
      fmt = "tab";
      break;
    case 10:
      fmt = "newline";
      break;
    case 0xb:
      fmt = "vertical tab";
      break;
    case 0xc:
      fmt = "formfeed";
      break;
    case 0xd:
      fmt = "carriage return";
    }
  }
  else {
    piVar8 = extraout_RDX_03;
    if (bVar1 == 0x20) {
      fmt = "space";
      goto LAB_001dc166;
    }
switchD_001dc101_caseD_1:
    char_unescape_buffer[1] = bVar1;
    char_unescape_buffer[0] = '\'';
    char_unescape_buffer[2] = '\'';
    char_unescape_buffer[3] = '\0';
    fmt = char_unescape_buffer;
  }
LAB_001dc166:
  mpc_err_string_cat(pcVar3,&local_2c,piVar8,fmt);
  mpc_err_string_cat(pcVar3,&local_2c,max_02,"\n");
  sVar6 = strlen(pcVar3);
  pcVar3 = (char *)realloc(pcVar3,sVar6 + 1);
  return pcVar3;
}

Assistant:

char *mpc_err_string(mpc_err_t *x) {

  int i;
  int pos = 0;
  int max = 1023;
  char *buffer = calloc(1, 1024);

  if (x->failure) {
    mpc_err_string_cat(buffer, &pos, &max,
    "%s: error: %s\n", x->filename, x->failure);
    return buffer;
  }

  mpc_err_string_cat(buffer, &pos, &max,
    "%s:%li:%li: error: expected ", x->filename, x->state.row+1, x->state.col+1);

  if (x->expected_num == 0) { mpc_err_string_cat(buffer, &pos, &max, "ERROR: NOTHING EXPECTED"); }
  if (x->expected_num == 1) { mpc_err_string_cat(buffer, &pos, &max, "%s", x->expected[0]); }
  if (x->expected_num >= 2) {

    for (i = 0; i < x->expected_num-2; i++) {
      mpc_err_string_cat(buffer, &pos, &max, "%s, ", x->expected[i]);
    }

    mpc_err_string_cat(buffer, &pos, &max, "%s or %s",
      x->expected[x->expected_num-2],
      x->expected[x->expected_num-1]);
  }

  mpc_err_string_cat(buffer, &pos, &max, " at ");
  mpc_err_string_cat(buffer, &pos, &max, mpc_err_char_unescape(x->received));
  mpc_err_string_cat(buffer, &pos, &max, "\n");

  return realloc(buffer, strlen(buffer) + 1);
}